

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O2

void __thiscall MkvInterface::handleTracksData(MkvInterface *this)

{
  int *UpperLevel;
  EbmlStream *pEVar1;
  EbmlUInteger *pEVar2;
  EbmlString *this_00;
  EbmlFloat *this_01;
  byte bVar3;
  uint8 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  EbmlElement *pEVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int *piVar9;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  string *psVar10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  FILE *pFVar14;
  KaxVideoPixelHeight *PixelHeight;
  float fVar15;
  size_t sStack_70;
  uint32 local_64;
  uint32 local_5c;
  undefined8 local_50 [4];
  
  pEVar1 = this->aStream;
  iVar6 = (*this->m_element1->_vptr_EbmlElement[4])();
  UpperLevel = &this->m_upperElementa;
  pEVar8 = libebml::EbmlStream::FindNextElement
                     (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar6) + 0x18),
                      UpperLevel,0xffffffff,this->m_allowDummy,1);
  this->m_element2a = pEVar8;
LAB_0018dd91:
  do {
    if ((pEVar8 == (EbmlElement *)0x0) || (0 < *UpperLevel)) goto LAB_0018e403;
    if (*UpperLevel < 0) {
      *UpperLevel = 0;
    }
    iVar6 = (*pEVar8->_vptr_EbmlElement[3])();
    if ((*(long *)(libmatroska::KaxTrackEntry::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_00,iVar6) + 2)) &&
       (*(int *)libmatroska::KaxTrackEntry::ClassInfos._8_8_ ==
        *(int *)CONCAT44(extraout_var_00,iVar6))) {
      bVar5 = false;
      local_64 = 0xffffffff;
      local_5c = local_64;
      while( true ) {
        pEVar1 = this->aStream;
        iVar6 = (*this->m_element2a->_vptr_EbmlElement[4])();
        pEVar8 = libebml::EbmlStream::FindNextElement
                           (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar6) + 0x18)
                            ,UpperLevel,0xffffffff,this->m_allowDummy,1);
        this->m_element3a = pEVar8;
        if ((pEVar8 == (EbmlElement *)0x0) || (0 < *UpperLevel)) break;
        if (*UpperLevel < 0) {
          *UpperLevel = 0;
        }
        iVar6 = (*pEVar8->_vptr_EbmlElement[3])(pEVar8);
        pEVar2 = (EbmlUInteger *)this->m_element3a;
        if ((*(long *)(libmatroska::KaxTrackNumber::ClassInfos._8_8_ + 8) ==
             *(long *)((int *)CONCAT44(extraout_var_02,iVar6) + 2)) &&
           (*(int *)libmatroska::KaxTrackNumber::ClassInfos._8_8_ ==
            *(int *)CONCAT44(extraout_var_02,iVar6))) {
          (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,this->aStream->Stream,1);
          bVar3 = libebml::EbmlUInteger::operator_cast_to_unsigned_char(pEVar2);
          pcVar13 = "\tTrack # %d\n";
          local_5c = (uint32)bVar3;
LAB_0018e29a:
          fprintf(_stderr,pcVar13);
        }
        else {
          iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
          pEVar2 = (EbmlUInteger *)this->m_element3a;
          if ((*(long *)(libmatroska::KaxTrackType::ClassInfos._8_8_ + 8) ==
               *(long *)((int *)CONCAT44(extraout_var_03,iVar6) + 2)) &&
             (*(int *)libmatroska::KaxTrackType::ClassInfos._8_8_ ==
              *(int *)CONCAT44(extraout_var_03,iVar6))) {
            (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,this->aStream->Stream,1);
            fwrite("\tTrack type : ",0xe,1,_stderr);
            uVar4 = libebml::EbmlUInteger::operator_cast_to_unsigned_char(pEVar2);
            if (uVar4 == '\x01') {
              fwrite("Video",5,1,_stderr);
              bVar5 = true;
            }
            else {
              if (uVar4 == '\x02') {
                pcVar13 = "Audio";
                sStack_70 = 5;
              }
              else {
                pcVar13 = "unknown";
                sStack_70 = 7;
              }
              fwrite(pcVar13,sStack_70,1,_stderr);
            }
            fputc(10,_stderr);
          }
          else {
            iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
            if ((*(long *)(libmatroska::KaxTrackFlagLacing::ClassInfos._8_8_ + 8) ==
                 *(long *)((int *)CONCAT44(extraout_var_04,iVar6) + 2)) &&
               (*(int *)libmatroska::KaxTrackFlagLacing::ClassInfos._8_8_ ==
                *(int *)CONCAT44(extraout_var_04,iVar6))) {
              fwrite("\tFlag Lacing\n",0xd,1,_stderr);
            }
            else {
              iVar6 = (*this->m_element3a->_vptr_EbmlElement[3])();
              this_00 = (EbmlString *)this->m_element3a;
              if ((*(long *)(libmatroska::KaxCodecID::ClassInfos._8_8_ + 8) ==
                   *(long *)((int *)CONCAT44(extraout_var_05,iVar6) + 2)) &&
                 (*(int *)libmatroska::KaxCodecID::ClassInfos._8_8_ ==
                  *(int *)CONCAT44(extraout_var_05,iVar6))) {
                (*(this_00->super_EbmlElement)._vptr_EbmlElement[10])
                          (this_00,this->aStream->Stream,1);
                pFVar14 = _stderr;
                psVar10 = libebml::EbmlString::operator_cast_to_string_(this_00);
                std::__cxx11::string::string((string *)local_50,(string *)psVar10);
                fprintf(pFVar14,"\tCodec ID   : %s\n",local_50[0]);
                std::__cxx11::string::~string((string *)local_50);
              }
              else {
                iVar6 = (*(this_00->super_EbmlElement)._vptr_EbmlElement[3])(this_00);
                pEVar2 = (EbmlUInteger *)this->m_element3a;
                if ((*(long *)(libmatroska::KaxTrackUID::ClassInfos._8_8_ + 8) ==
                     *(long *)((int *)CONCAT44(extraout_var_06,iVar6) + 2)) &&
                   (*(int *)libmatroska::KaxTrackUID::ClassInfos._8_8_ ==
                    *(int *)CONCAT44(extraout_var_06,iVar6))) {
                  (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])
                            (pEVar2,this->aStream->Stream,1);
                  local_64 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(pEVar2);
                  pcVar13 = "\tTrack UID   : %d\n";
                  goto LAB_0018e29a;
                }
                iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
                if ((*(long *)(libmatroska::KaxTrackVideo::ClassInfos._8_8_ + 8) ==
                     *(long *)((int *)CONCAT44(extraout_var_07,iVar6) + 2)) &&
                   (*(int *)libmatroska::KaxTrackVideo::ClassInfos._8_8_ ==
                    *(int *)CONCAT44(extraout_var_07,iVar6))) {
                  pEVar8 = this->m_element3a;
                  uVar11 = 0;
                  while( true ) {
                    uVar12 = (ulong)uVar11;
                    if ((ulong)((long)(pEVar8[1].Size - (long)pEVar8[1]._vptr_EbmlElement) >> 3) <=
                        uVar12) break;
                    piVar9 = (int *)(**(code **)(*(long *)pEVar8[1]._vptr_EbmlElement[uVar12] + 0x18
                                                ))();
                    pEVar2 = (EbmlUInteger *)pEVar8[1]._vptr_EbmlElement[uVar12];
                    if ((*(long *)(libmatroska::KaxVideoFlagInterlaced::ClassInfos._8_8_ + 8) ==
                         *(long *)(piVar9 + 2)) &&
                       (*(int *)libmatroska::KaxVideoFlagInterlaced::ClassInfos._8_8_ == *piVar9)) {
                      (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])
                                (pEVar2,this->aStream->Stream,1);
                      pFVar14 = _stderr;
                      uVar7 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(pEVar2);
                      pcVar13 = "\tInterlaced : %d\n";
LAB_0018e12b:
                      fprintf(pFVar14,pcVar13,(ulong)uVar7);
                    }
                    else {
                      iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
                      pEVar2 = (EbmlUInteger *)pEVar8[1]._vptr_EbmlElement[uVar12];
                      if ((*(long *)(libmatroska::KaxVideoPixelWidth::ClassInfos._8_8_ + 8) ==
                           *(long *)((int *)CONCAT44(extraout_var_08,iVar6) + 2)) &&
                         (*(int *)libmatroska::KaxVideoPixelWidth::ClassInfos._8_8_ ==
                          *(int *)CONCAT44(extraout_var_08,iVar6))) {
                        (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])
                                  (pEVar2,this->aStream->Stream,1);
                        pFVar14 = _stderr;
                        uVar7 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(pEVar2);
                        pcVar13 = "\tPixelWidth : %d\n";
                        goto LAB_0018e12b;
                      }
                      iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
                      pEVar2 = (EbmlUInteger *)pEVar8[1]._vptr_EbmlElement[uVar12];
                      if ((*(long *)(libmatroska::KaxVideoPixelHeight::ClassInfos._8_8_ + 8) ==
                           *(long *)((int *)CONCAT44(extraout_var_09,iVar6) + 2)) &&
                         (*(int *)libmatroska::KaxVideoPixelHeight::ClassInfos._8_8_ ==
                          *(int *)CONCAT44(extraout_var_09,iVar6))) {
                        (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])
                                  (pEVar2,this->aStream->Stream,1);
                        pFVar14 = _stderr;
                        uVar7 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(pEVar2);
                        pcVar13 = "\tPixelHeight : %d\n";
                        goto LAB_0018e12b;
                      }
                      iVar6 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
                      if ((*(long *)(libmatroska::KaxVideoFrameRate::ClassInfos._8_8_ + 8) ==
                           *(long *)((int *)CONCAT44(extraout_var_10,iVar6) + 2)) &&
                         (*(int *)libmatroska::KaxVideoFrameRate::ClassInfos._8_8_ ==
                          *(int *)CONCAT44(extraout_var_10,iVar6))) {
                        this_01 = (EbmlFloat *)pEVar8[1]._vptr_EbmlElement[uVar12];
                        (*(this_01->super_EbmlElement)._vptr_EbmlElement[10])
                                  (this_01,this->aStream->Stream,1);
                        pFVar14 = _stderr;
                        fVar15 = libebml::EbmlFloat::operator_cast_to_float(this_01);
                        fprintf(pFVar14,"\tFrameRate : %f\n",(double)fVar15);
                      }
                    }
                    uVar11 = uVar11 + 1;
                  }
                }
              }
            }
          }
        }
        pEVar1 = this->aStream;
        pEVar8 = this->m_element3a;
        iVar6 = (*pEVar8->_vptr_EbmlElement[4])(pEVar8);
        libebml::EbmlElement::SkipData
                  (pEVar8,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_11,iVar6) + 0x18),
                   (EbmlElement *)0x0,false);
        if (this->m_element3a != (EbmlElement *)0x0) {
          (*this->m_element3a->_vptr_EbmlElement[1])();
        }
      }
      if (bVar5) {
        this->m_trackNr = local_5c;
        this->m_trackUID = local_64;
      }
    }
    if (0 < *UpperLevel) break;
    pEVar1 = this->aStream;
    pEVar8 = this->m_element2a;
    iVar6 = (*pEVar8->_vptr_EbmlElement[4])(pEVar8);
    libebml::EbmlElement::SkipData
              (pEVar8,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_12,iVar6) + 0x18),
               (EbmlElement *)0x0,false);
    if (this->m_element2a != (EbmlElement *)0x0) {
      (*this->m_element2a->_vptr_EbmlElement[1])();
    }
    pEVar1 = this->aStream;
    iVar6 = (*this->m_element1->_vptr_EbmlElement[4])();
    pEVar8 = libebml::EbmlStream::FindNextElement
                       (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_13,iVar6) + 0x18),
                        UpperLevel,0xffffffff,this->m_allowDummy,1);
    this->m_element2a = pEVar8;
  } while( true );
  iVar6 = *UpperLevel + -1;
  this->m_upperElementa = iVar6;
  if (this->m_element2a != (EbmlElement *)0x0) {
    (*this->m_element2a->_vptr_EbmlElement[1])();
    iVar6 = *UpperLevel;
  }
  pEVar8 = this->m_element3a;
  this->m_element2a = pEVar8;
  if (0 < iVar6) {
LAB_0018e403:
    fputc(10,_stderr);
    return;
  }
  goto LAB_0018dd91;
}

Assistant:

void MkvInterface::handleTracksData()
{
    // handle the data in Tracks here.
    // poll for new tracks and handle them
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);

    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0) break;
        if (m_upperElementa < 0) m_upperElementa = 0;
        
        if (EbmlId(*m_element2a) == KaxTrackEntry::ClassInfos.GlobalId)
        {
            m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            
            bool videoTrackFound = false;
            int trackNr = -1, trackUID = -1;
            
            while (m_element3a != NULL)
            {
                if (m_upperElementa > 0)
                    break;
                if (m_upperElementa < 0)
                    m_upperElementa = 0;
                    
                // read the data we care about in a track
                // Track number
                if (EbmlId(*m_element3a) == KaxTrackNumber::ClassInfos.GlobalId)
                {
                    KaxTrackNumber & TrackNum = *static_cast<KaxTrackNumber*>(m_element3a);
                    TrackNum.ReadData(aStream->I_O());
                    trackNr = uint8(TrackNum);
                    fprintf(stderr, "\tTrack # %d\n", trackNr);
                }
                
                // Track type
                else if (EbmlId(*m_element3a) == KaxTrackType::ClassInfos.GlobalId)
                {
                    KaxTrackType & TrackType = *static_cast<KaxTrackType*>(m_element3a);
                    TrackType.ReadData(aStream->I_O());
                    fprintf(stderr, "\tTrack type : ");
                    switch(uint8(TrackType))
                    {
                        case track_audio:
                            fprintf(stderr, "Audio");
                            break;
                        case track_video:
                            fprintf(stderr, "Video");
                            videoTrackFound = true;
                            break;
                        default:
                            fprintf(stderr, "unknown");
                    }
                    fprintf(stderr, "\n");
                }

                else if (EbmlId(*m_element3a) == KaxTrackFlagLacing::ClassInfos.GlobalId)
                {
                    fprintf(stderr, "\tFlag Lacing\n");
                }
                else if (EbmlId(*m_element3a) == KaxCodecID::ClassInfos.GlobalId)
                {
                    KaxCodecID & CodecID = *static_cast<KaxCodecID*>(m_element3a);
                    CodecID.ReadData(aStream->I_O());
                    fprintf(stderr, "\tCodec ID   : %s\n", std::string(CodecID).c_str());
                }
                else if (EbmlId(*m_element3a) == KaxTrackUID::ClassInfos.GlobalId)
                {
                    KaxTrackUID & TrackUID = *static_cast<KaxTrackUID*>(m_element3a);
                    TrackUID.ReadData(aStream->I_O());
                    trackUID = (unsigned int)TrackUID;
                    fprintf(stderr, "\tTrack UID   : %d\n", trackUID);
                }
                else if (EbmlId(*m_element3a) == KaxTrackVideo::ClassInfos.GlobalId)
                {
                    KaxTrackVideo & TrackVideo = *static_cast<KaxTrackVideo*>(m_element3a);
                    for (unsigned int j = 0; j<TrackVideo.ListSize(); j++)
                    {
                        if (EbmlId(*TrackVideo[j]) == KaxVideoFlagInterlaced::ClassInfos.GlobalId) 
                        {
	                        KaxVideoFlagInterlaced &Interlaced = *static_cast<KaxVideoFlagInterlaced*>(TrackVideo[j]);
	                        Interlaced.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tInterlaced : %d\n", (unsigned int)Interlaced);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelWidth::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelWidth &PixelWidth = *static_cast<KaxVideoPixelWidth*>(TrackVideo[j]);
	                        PixelWidth.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelWidth : %d\n", (unsigned int)PixelWidth);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelHeight::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelHeight &PixelHeight = *static_cast<KaxVideoPixelHeight*>(TrackVideo[j]);
	                        PixelHeight.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelHeight : %d\n", (unsigned int)PixelHeight);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoFrameRate::ClassInfos.GlobalId)
                        {
	                        KaxVideoFrameRate &FrameRate = *static_cast<KaxVideoFrameRate*>(TrackVideo[j]);
	                        FrameRate.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tFrameRate : %f\n", (float)FrameRate);
                        }				
                    }
                }
                
                m_element3a->SkipData(*aStream, m_element3a->Generic().Context);
                delete m_element3a;

                m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            }
            
            if (videoTrackFound)
            {
                m_trackNr = trackNr;
                m_trackUID = trackUID;
            }
        }
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}